

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  pointer pcVar1;
  int iVar2;
  IResultCapture *pIVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  iVar2 = std::uncaught_exceptions();
  if ((iVar2 < 1) && (this->m_moved == false)) {
    pIVar3 = getResultCapture();
    (*pIVar3->_vptr_IResultCapture[7])(pIVar3,this);
  }
  pcVar1 = (this->m_info).message._M_dataplus._M_p;
  paVar4 = &(this->m_info).message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
    if (!uncaught_exceptions() && !m_moved) {
      getResultCapture().popScopedMessage(m_info);
    }
  }